

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

Dec_Graph_t * Abc_ManResubDivs2(Abc_ManRes_t *p,int Required)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Dec_Graph_t *pDVar8;
  Abc_Obj_t *pObj2;
  long lVar9;
  Abc_Obj_t *pObj1;
  long lVar10;
  Abc_Obj_t *pObj0;
  ulong uVar11;
  int fOrGate;
  ulong uVar12;
  ulong uVar13;
  
  pvVar4 = (p->pRoot->field_5).pData;
  lVar9 = (long)p->vDivs1UP->nSize;
  if (0 < lVar9) {
    uVar1 = p->vDivs2UP0->nSize;
    lVar10 = 0;
    do {
      if (0 < (int)uVar1) {
        pObj0 = (Abc_Obj_t *)p->vDivs1UP->pArray[lVar10];
        lVar5 = *(long *)(((ulong)pObj0 & 0xfffffffffffffffe) + 0x38);
        uVar2 = p->vDivs2UP1->nSize;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        uVar12 = 0;
        do {
          if (uVar12 == uVar2) goto LAB_003062c2;
          pObj1 = (Abc_Obj_t *)p->vDivs2UP0->pArray[uVar12];
          pObj2 = (Abc_Obj_t *)p->vDivs2UP1->pArray[uVar12];
          lVar6 = *(long *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x38);
          lVar7 = *(long *)(((ulong)pObj2 & 0xfffffffffffffffe) + 0x38);
          uVar3 = p->nWords;
          uVar11 = (ulong)uVar3;
          if (((ulong)pObj0 & 1) != 0) {
            if (((ulong)pObj1 & 1) == 0) {
              if (((ulong)pObj2 & 1) == 0) {
                if ((int)uVar3 < 1) goto LAB_00305f86;
                uVar13 = 0;
                while ((p->pCareSet[uVar13] &
                       ((*(uint *)(lVar7 + uVar13 * 4) & *(uint *)(lVar6 + uVar13 * 4) |
                        ~*(uint *)(lVar5 + uVar13 * 4)) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) ==
                       0) {
                  uVar13 = uVar13 + 1;
                  if (uVar11 == uVar13) goto LAB_00306284;
                }
              }
              else {
                if ((int)uVar3 < 1) goto LAB_00305f86;
                uVar13 = 0;
                while ((p->pCareSet[uVar13] &
                       ((~*(uint *)(lVar7 + uVar13 * 4) & *(uint *)(lVar6 + uVar13 * 4) |
                        ~*(uint *)(lVar5 + uVar13 * 4)) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) ==
                       0) {
                  uVar13 = uVar13 + 1;
                  if (uVar11 == uVar13) goto LAB_00306284;
                }
              }
            }
            else if (((ulong)pObj2 & 1) == 0) {
              if ((int)uVar3 < 1) goto LAB_00305f86;
              uVar13 = 0;
              while ((p->pCareSet[uVar13] &
                     ((~*(uint *)(lVar6 + uVar13 * 4) & *(uint *)(lVar7 + uVar13 * 4) |
                      ~*(uint *)(lVar5 + uVar13 * 4)) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0)
              {
                uVar13 = uVar13 + 1;
                if (uVar11 == uVar13) goto LAB_00306284;
              }
            }
            else {
              if ((int)uVar3 < 1) goto LAB_00305f86;
              uVar13 = 0;
              while ((p->pCareSet[uVar13] &
                     ((~*(uint *)(lVar5 + uVar13 * 4) | *(uint *)(lVar6 + uVar13 * 4) |
                      *(uint *)(lVar7 + uVar13 * 4)) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0)
              {
                uVar13 = uVar13 + 1;
                if (uVar11 == uVar13) goto LAB_00306284;
              }
            }
            goto LAB_00305f89;
          }
          if (((ulong)pObj1 & 1) == 0) {
            if (((ulong)pObj2 & 1) == 0) {
              if ((int)uVar3 < 1) {
LAB_00305f86:
                uVar13 = 0;
              }
              else {
                uVar13 = 0;
                while ((p->pCareSet[uVar13] &
                       ((*(uint *)(lVar7 + uVar13 * 4) & *(uint *)(lVar6 + uVar13 * 4) |
                        *(uint *)(lVar5 + uVar13 * 4)) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0
                      ) {
                  uVar13 = uVar13 + 1;
                  if (uVar11 == uVar13) goto LAB_00306284;
                }
              }
            }
            else {
              if ((int)uVar3 < 1) goto LAB_00305f86;
              uVar13 = 0;
              while ((p->pCareSet[uVar13] &
                     ((~*(uint *)(lVar7 + uVar13 * 4) & *(uint *)(lVar6 + uVar13 * 4) |
                      *(uint *)(lVar5 + uVar13 * 4)) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0)
              {
                uVar13 = uVar13 + 1;
                if (uVar11 == uVar13) goto LAB_00306284;
              }
            }
          }
          else if (((ulong)pObj2 & 1) == 0) {
            if ((int)uVar3 < 1) goto LAB_00305f86;
            uVar13 = 0;
            while ((p->pCareSet[uVar13] &
                   ((~*(uint *)(lVar6 + uVar13 * 4) & *(uint *)(lVar7 + uVar13 * 4) |
                    *(uint *)(lVar5 + uVar13 * 4)) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0) {
              uVar13 = uVar13 + 1;
              if (uVar11 == uVar13) goto LAB_00306284;
            }
          }
          else {
            if ((int)uVar3 < 1) goto LAB_00305f86;
            uVar13 = 0;
            while ((p->pCareSet[uVar13] &
                   ((*(uint *)(lVar6 + uVar13 * 4) | *(uint *)(lVar5 + uVar13 * 4) |
                    *(uint *)(lVar7 + uVar13 * 4)) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0) {
              uVar13 = uVar13 + 1;
              if (uVar11 == uVar13) goto LAB_00306284;
            }
          }
LAB_00305f89:
          if ((uint)uVar13 == uVar3) {
LAB_00306284:
            p->nUsedNode2OrAnd = p->nUsedNode2OrAnd + 1;
            fOrGate = 1;
            goto LAB_003062af;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar9);
  }
  lVar9 = (long)p->vDivs1UN->nSize;
  if (0 < lVar9) {
    uVar1 = p->vDivs2UN0->nSize;
    lVar10 = 0;
    do {
      if (0 < (int)uVar1) {
        pObj0 = (Abc_Obj_t *)p->vDivs1UN->pArray[lVar10];
        lVar5 = *(long *)(((ulong)pObj0 & 0xfffffffffffffffe) + 0x38);
        uVar2 = p->vDivs2UN1->nSize;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        uVar12 = 0;
        do {
          if (uVar12 == uVar2) {
LAB_003062c2:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj1 = (Abc_Obj_t *)p->vDivs2UN0->pArray[uVar12];
          pObj2 = (Abc_Obj_t *)p->vDivs2UN1->pArray[uVar12];
          lVar6 = *(long *)(((ulong)pObj1 & 0xfffffffffffffffe) + 0x38);
          lVar7 = *(long *)(((ulong)pObj2 & 0xfffffffffffffffe) + 0x38);
          uVar3 = p->nWords;
          uVar11 = (ulong)uVar3;
          if (((ulong)pObj0 & 1) != 0) {
            if (((ulong)pObj1 & 1) == 0) {
              if (((ulong)pObj2 & 1) == 0) {
                if ((int)uVar3 < 1) goto LAB_0030624c;
                uVar13 = 0;
                while ((p->pCareSet[uVar13] &
                       (~*(uint *)(lVar5 + uVar13 * 4) & *(uint *)(lVar6 + uVar13 * 4) &
                        *(uint *)(lVar7 + uVar13 * 4) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0)
                {
                  uVar13 = uVar13 + 1;
                  if (uVar11 == uVar13) goto LAB_0030629c;
                }
              }
              else {
                if ((int)uVar3 < 1) goto LAB_0030624c;
                uVar13 = 0;
                while ((p->pCareSet[uVar13] &
                       (~(*(uint *)(lVar7 + uVar13 * 4) | *(uint *)(lVar5 + uVar13 * 4)) &
                        *(uint *)(lVar6 + uVar13 * 4) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0)
                {
                  uVar13 = uVar13 + 1;
                  if (uVar11 == uVar13) goto LAB_0030629c;
                }
              }
            }
            else if (((ulong)pObj2 & 1) == 0) {
              if ((int)uVar3 < 1) goto LAB_0030624c;
              uVar13 = 0;
              while ((p->pCareSet[uVar13] &
                     (~(*(uint *)(lVar6 + uVar13 * 4) | *(uint *)(lVar5 + uVar13 * 4)) &
                      *(uint *)(lVar7 + uVar13 * 4) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0) {
                uVar13 = uVar13 + 1;
                if (uVar11 == uVar13) goto LAB_0030629c;
              }
            }
            else {
              if ((int)uVar3 < 1) goto LAB_0030624c;
              uVar13 = 0;
              while ((p->pCareSet[uVar13] &
                     ((*(uint *)(lVar7 + uVar13 * 4) | *(uint *)(lVar6 + uVar13 * 4)) &
                      ~*(uint *)(lVar5 + uVar13 * 4) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0)
              {
                uVar13 = uVar13 + 1;
                if (uVar11 == uVar13) goto LAB_0030629c;
              }
            }
            goto LAB_0030624f;
          }
          if (((ulong)pObj1 & 1) == 0) {
            if (((ulong)pObj2 & 1) == 0) {
              if ((int)uVar3 < 1) {
LAB_0030624c:
                uVar13 = 0;
              }
              else {
                uVar13 = 0;
                while ((p->pCareSet[uVar13] &
                       (*(uint *)(lVar6 + uVar13 * 4) & *(uint *)(lVar5 + uVar13 * 4) &
                        *(uint *)(lVar7 + uVar13 * 4) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0)
                {
                  uVar13 = uVar13 + 1;
                  if (uVar11 == uVar13) goto LAB_0030629c;
                }
              }
            }
            else {
              if ((int)uVar3 < 1) goto LAB_0030624c;
              uVar13 = 0;
              while ((p->pCareSet[uVar13] &
                     (*(uint *)(lVar6 + uVar13 * 4) & *(uint *)(lVar5 + uVar13 * 4) &
                      ~*(uint *)(lVar7 + uVar13 * 4) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0)
              {
                uVar13 = uVar13 + 1;
                if (uVar11 == uVar13) goto LAB_0030629c;
              }
            }
          }
          else if (((ulong)pObj2 & 1) == 0) {
            if ((int)uVar3 < 1) goto LAB_0030624c;
            uVar13 = 0;
            while ((p->pCareSet[uVar13] &
                   (~*(uint *)(lVar6 + uVar13 * 4) & *(uint *)(lVar5 + uVar13 * 4) &
                    *(uint *)(lVar7 + uVar13 * 4) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0) {
              uVar13 = uVar13 + 1;
              if (uVar11 == uVar13) goto LAB_0030629c;
            }
          }
          else {
            if ((int)uVar3 < 1) goto LAB_0030624c;
            uVar13 = 0;
            while ((p->pCareSet[uVar13] &
                   ((*(uint *)(lVar7 + uVar13 * 4) | *(uint *)(lVar6 + uVar13 * 4)) &
                    *(uint *)(lVar5 + uVar13 * 4) ^ *(uint *)((long)pvVar4 + uVar13 * 4))) == 0) {
              uVar13 = uVar13 + 1;
              if (uVar11 == uVar13) goto LAB_0030629c;
            }
          }
LAB_0030624f:
          if ((uint)uVar13 == uVar3) {
LAB_0030629c:
            p->nUsedNode2AndOr = p->nUsedNode2AndOr + 1;
            fOrGate = 0;
LAB_003062af:
            pDVar8 = Abc_ManResubQuit2(p->pRoot,pObj0,pObj1,pObj2,fOrGate);
            return pDVar8;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar9);
  }
  return (Dec_Graph_t *)0x0;
}

Assistant:

Dec_Graph_t * Abc_ManResubDivs2( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj0, * pObj1, * pObj2;
    unsigned * puData0, * puData1, * puData2, * puDataR;
    int i, k, w;
    puDataR = (unsigned *)p->pRoot->pData;
    // check positive unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1UP, pObj0, i )
    {
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs2UP0, pObj1, k )
        {
            pObj2 = (Abc_Obj_t *)Vec_PtrEntry( p->vDivs2UP1, k );

            puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
            puData2 = (unsigned *)Abc_ObjRegular(pObj2)->pData;
            if ( Abc_ObjIsComplement(pObj0) )
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] | (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            else
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] | (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] | (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            if ( w == p->nWords )
            {
                p->nUsedNode2OrAnd++;
                return Abc_ManResubQuit2( p->pRoot, pObj0, pObj1, pObj2, 1 );
            }
        }
    }
    // check negative unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1UN, pObj0, i )
    {
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs2UN0, pObj1, k )
        {
            pObj2 = (Abc_Obj_t *)Vec_PtrEntry( p->vDivs2UN1, k );

            puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
            puData2 = (unsigned *)Abc_ObjRegular(pObj2)->pData;
            if ( Abc_ObjIsComplement(pObj0) )
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((~puData0[w] & (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            else
            {
                if ( Abc_ObjIsComplement(pObj1) && Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] | puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] | puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj1) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (~puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (~puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else if ( Abc_ObjIsComplement(pObj2) )
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & ~puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] & ~puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
                else 
                {
                    for ( w = 0; w < p->nWords; w++ )
    //                    if ( (puData0[w] & (puData1[w] & puData2[w])) != puDataR[w] )
                        if ( ((puData0[w] & (puData1[w] & puData2[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                            break;
                }
            }
            if ( w == p->nWords )
            {
                p->nUsedNode2AndOr++;
                return Abc_ManResubQuit2( p->pRoot, pObj0, pObj1, pObj2, 0 );
            }
        }
    }
    return NULL;
}